

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall ON_RTree::CreateMeshFaceTree(ON_RTree *this,ON_Mesh *mesh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  ON_MeshFace *pOVar7;
  ON_3fPoint *pOVar8;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_MeshFace *pOVar9;
  ON_3dPoint *pOVar10;
  ON_3dPoint *pOVar11;
  ON_3dPoint *local_a8;
  ON_3dPoint *meshdV;
  ON_3fPoint *meshfV;
  ON_MeshFace *meshF;
  int *fvi;
  uint fcount;
  uint fi;
  ON_3dPoint V;
  double fmax [3];
  double local_38;
  double fmin [3];
  ON_Mesh *mesh_local;
  ON_RTree *this_local;
  
  fmin[2] = (double)mesh;
  RemoveAll(this);
  if (fmin[2] == 0.0) {
    this_local._7_1_ = false;
  }
  else {
    uVar6 = ON_SimpleArray<ON_MeshFace>::UnsignedCount
                      ((ON_SimpleArray<ON_MeshFace> *)((long)fmin[2] + 0x40));
    if (uVar6 == 0) {
      this_local._7_1_ = false;
    }
    else {
      pOVar7 = ON_SimpleArray<ON_MeshFace>::Array
                         ((ON_SimpleArray<ON_MeshFace> *)((long)fmin[2] + 0x40));
      if (pOVar7 == (ON_MeshFace *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        pOVar8 = ON_SimpleArray<ON_3fPoint>::Array
                           ((ON_SimpleArray<ON_3fPoint> *)((long)fmin[2] + 0x28));
        bVar5 = ON_Mesh::HasDoublePrecisionVertices((ON_Mesh *)fmin[2]);
        if (bVar5) {
          this_00 = &ON_Mesh::DoublePrecisionVertices((ON_Mesh *)fmin[2])->
                     super_ON_SimpleArray<ON_3dPoint>;
          local_a8 = ON_SimpleArray<ON_3dPoint>::Array(this_00);
        }
        else {
          local_a8 = (ON_3dPoint *)0x0;
        }
        if (pOVar8 == (ON_3fPoint *)0x0) {
          if (local_a8 == (ON_3dPoint *)0x0) {
            return false;
          }
          for (fvi._4_4_ = 0; fvi._4_4_ < uVar6; fvi._4_4_ = fvi._4_4_ + 1) {
            pOVar9 = pOVar7 + fvi._4_4_;
            pOVar10 = local_a8 + pOVar9->vi[0];
            dVar1 = pOVar10->x;
            pOVar11 = local_a8 + pOVar9->vi[1];
            dVar2 = pOVar11->x;
            V.z = dVar1;
            local_38 = dVar2;
            if ((dVar1 <= dVar2) && (local_38 = dVar1, dVar1 < dVar2)) {
              V.z = dVar2;
            }
            fmin[0] = pOVar11->y;
            if (pOVar10->y <= pOVar11->y) {
              fmin[0] = pOVar10->y;
            }
            fmin[1] = pOVar11->z;
            if (pOVar10->z <= pOVar11->z) {
              fmin[1] = pOVar10->z;
            }
            pOVar10 = local_a8 + pOVar9->vi[2];
            _fcount = pOVar10->x;
            V.x = pOVar10->y;
            V.y = pOVar10->z;
            dVar1 = _fcount;
            if ((local_38 <= _fcount) && (dVar1 = local_38, V.z < _fcount)) {
              V.z = _fcount;
            }
            local_38 = dVar1;
            dVar1 = V.x;
            if (fmin[0] <= V.x) {
              dVar1 = fmin[0];
            }
            fmin[0] = dVar1;
            dVar1 = V.y;
            if (fmin[1] <= V.y) {
              dVar1 = fmin[1];
            }
            fmin[1] = dVar1;
            dVar1 = fmin[1];
            if (pOVar9->vi[2] != pOVar9->vi[3]) {
              pOVar10 = local_a8 + pOVar9->vi[3];
              _fcount = pOVar10->x;
              V.x = pOVar10->y;
              V.y = pOVar10->z;
              dVar1 = _fcount;
              if ((local_38 <= _fcount) && (dVar1 = local_38, V.z < _fcount)) {
                V.z = _fcount;
              }
              local_38 = dVar1;
              dVar1 = V.x;
              if (fmin[0] <= V.x) {
                dVar1 = fmin[0];
              }
              fmin[0] = dVar1;
              dVar1 = V.y;
              if (fmin[1] <= V.y) {
                dVar1 = fmin[1];
              }
            }
            fmin[1] = dVar1;
            bVar5 = Insert(this,&local_38,&V.z,fvi._4_4_);
            if (!bVar5) {
              RemoveAll(this);
              return false;
            }
          }
        }
        else if (local_a8 == (ON_3dPoint *)0x0) {
          for (fvi._4_4_ = 0; fvi._4_4_ < uVar6; fvi._4_4_ = fvi._4_4_ + 1) {
            pOVar9 = pOVar7 + fvi._4_4_;
            ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[0]);
            V.z = _fcount;
            local_38 = _fcount;
            fmin[0] = V.x;
            fmin[1] = V.y;
            ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[1]);
            if (local_38 <= _fcount) {
              if (V.z < _fcount) {
                V.z = _fcount;
              }
            }
            else {
              local_38 = _fcount;
            }
            if (V.x < fmin[0]) {
              fmin[0] = V.x;
            }
            if (V.y < fmin[1]) {
              fmin[1] = V.y;
            }
            ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[2]);
            if (local_38 <= _fcount) {
              if (V.z < _fcount) {
                V.z = _fcount;
              }
            }
            else {
              local_38 = _fcount;
            }
            if (V.x < fmin[0]) {
              fmin[0] = V.x;
            }
            if (V.y < fmin[1]) {
              fmin[1] = V.y;
            }
            if (pOVar9->vi[2] != pOVar9->vi[3]) {
              ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[3]);
              if (local_38 <= _fcount) {
                if (V.z < _fcount) {
                  V.z = _fcount;
                }
              }
              else {
                local_38 = _fcount;
              }
              if (V.x < fmin[0]) {
                fmin[0] = V.x;
              }
              if (V.y < fmin[1]) {
                fmin[1] = V.y;
              }
            }
            bVar5 = Insert(this,&local_38,&V.z,fvi._4_4_);
            if (!bVar5) {
              RemoveAll(this);
              return false;
            }
          }
        }
        else {
          for (fvi._4_4_ = 0; fvi._4_4_ < uVar6; fvi._4_4_ = fvi._4_4_ + 1) {
            pOVar9 = pOVar7 + fvi._4_4_;
            ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[0]);
            V.z = _fcount;
            local_38 = _fcount;
            fmin[0] = V.x;
            fmin[1] = V.y;
            pOVar10 = local_a8 + pOVar9->vi[0];
            dVar1 = pOVar10->x;
            dVar2 = pOVar10->y;
            dVar3 = pOVar10->z;
            dVar4 = dVar1;
            if ((_fcount <= dVar1) && (dVar4 = local_38, _fcount < dVar1)) {
              V.z = dVar1;
            }
            local_38 = dVar4;
            dVar4 = dVar2;
            if (V.x <= dVar2) {
              dVar4 = fmin[0];
            }
            fmin[0] = dVar4;
            dVar4 = dVar3;
            if (V.y <= dVar3) {
              dVar4 = fmin[1];
            }
            fmin[1] = dVar4;
            _fcount = dVar1;
            V.x = dVar2;
            V.y = dVar3;
            ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[1]);
            if (local_38 <= _fcount) {
              if (V.z < _fcount) {
                V.z = _fcount;
              }
            }
            else {
              local_38 = _fcount;
            }
            if (V.x < fmin[0]) {
              fmin[0] = V.x;
            }
            if (V.y < fmin[1]) {
              fmin[1] = V.y;
            }
            pOVar10 = local_a8 + pOVar9->vi[1];
            _fcount = pOVar10->x;
            V.x = pOVar10->y;
            V.y = pOVar10->z;
            dVar1 = _fcount;
            if ((local_38 <= _fcount) && (dVar1 = local_38, V.z < _fcount)) {
              V.z = _fcount;
            }
            local_38 = dVar1;
            dVar1 = V.x;
            if (fmin[0] <= V.x) {
              dVar1 = fmin[0];
            }
            fmin[0] = dVar1;
            dVar1 = V.y;
            if (fmin[1] <= V.y) {
              dVar1 = fmin[1];
            }
            fmin[1] = dVar1;
            ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[2]);
            if (local_38 <= _fcount) {
              if (V.z < _fcount) {
                V.z = _fcount;
              }
            }
            else {
              local_38 = _fcount;
            }
            if (V.x < fmin[0]) {
              fmin[0] = V.x;
            }
            if (V.y < fmin[1]) {
              fmin[1] = V.y;
            }
            pOVar10 = local_a8 + pOVar9->vi[2];
            _fcount = pOVar10->x;
            V.x = pOVar10->y;
            V.y = pOVar10->z;
            dVar1 = _fcount;
            if ((local_38 <= _fcount) && (dVar1 = local_38, V.z < _fcount)) {
              V.z = _fcount;
            }
            local_38 = dVar1;
            dVar1 = V.x;
            if (fmin[0] <= V.x) {
              dVar1 = fmin[0];
            }
            fmin[0] = dVar1;
            dVar1 = V.y;
            if (fmin[1] <= V.y) {
              dVar1 = fmin[1];
            }
            fmin[1] = dVar1;
            dVar1 = fmin[1];
            if (pOVar9->vi[2] != pOVar9->vi[3]) {
              ON_3dPoint::operator=((ON_3dPoint *)&fcount,pOVar8 + pOVar9->vi[3]);
              if (local_38 <= _fcount) {
                if (V.z < _fcount) {
                  V.z = _fcount;
                }
              }
              else {
                local_38 = _fcount;
              }
              if (V.x < fmin[0]) {
                fmin[0] = V.x;
              }
              if (V.y < fmin[1]) {
                fmin[1] = V.y;
              }
              pOVar10 = local_a8 + pOVar9->vi[3];
              _fcount = pOVar10->x;
              V.x = pOVar10->y;
              V.y = pOVar10->z;
              dVar1 = _fcount;
              if ((local_38 <= _fcount) && (dVar1 = local_38, V.z < _fcount)) {
                V.z = _fcount;
              }
              local_38 = dVar1;
              dVar1 = V.x;
              if (fmin[0] <= V.x) {
                dVar1 = fmin[0];
              }
              fmin[0] = dVar1;
              dVar1 = V.y;
              if (fmin[1] <= V.y) {
                dVar1 = fmin[1];
              }
            }
            fmin[1] = dVar1;
            bVar5 = Insert(this,&local_38,&V.z,fvi._4_4_);
            if (!bVar5) {
              RemoveAll(this);
              return false;
            }
          }
        }
        this_local._7_1_ = this->m_root != (ON_RTreeNode *)0x0;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::CreateMeshFaceTree( const ON_Mesh* mesh )
{
  double fmin[3], fmax[3];
  ON_3dPoint V;
  unsigned int fi, fcount;
  const int* fvi;
  const ON_MeshFace* meshF;
  const ON_3fPoint* meshfV;
  const ON_3dPoint* meshdV;

  RemoveAll();

  if ( 0 == mesh )
    return false;

  fcount = mesh->m_F.UnsignedCount();
  if ( fcount <= 0 )
    return false;

  meshF = mesh->m_F.Array();
  if ( 0 == meshF )
    return false;

  meshfV = mesh->m_V.Array();

  meshdV = mesh->HasDoublePrecisionVertices() 
         ? mesh->DoublePrecisionVertices().Array() 
         : 0;

  if ( 0 != meshfV )
  {
    if ( 0 != meshdV )
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;
        V = meshdV[fvi[0]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
          V = meshdV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
    else
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
  }
  else if ( 0 != meshdV )
  {
    for ( fi = 0; fi < fcount; fi++ )
    {
      fvi = meshF[fi].vi;

      V = meshdV[fvi[0]];
      fmin[0] = fmax[0] = V.x;
      fmin[1] = fmax[1] = V.y;
      fmin[2] = fmax[2] = V.z;

      V = meshdV[fvi[1]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      V = meshdV[fvi[2]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      if ( fvi[2] != fvi[3] )
      {
        V = meshdV[fvi[3]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
      }

      if ( !Insert(fmin,fmax,fi) )
      {
        RemoveAll();
        return false;
      }
    }
  }
  else
  {
    // no vertices
    return false;
  }

  return (0 != m_root);
}